

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

void * tinfl_decompress_mem_to_heap(void *pSrc_buf,size_t src_buf_len,size_t *pOut_len,int flags)

{
  tinfl_status tVar1;
  ulong __size;
  mz_uint8 *pOut_buf_start;
  mz_uint8 *pmVar2;
  size_t sVar3;
  long lVar4;
  size_t dst_buf_size;
  size_t src_buf_size;
  tinfl_decompressor decomp;
  size_t local_2b48;
  size_t local_2b40;
  void *local_2b38;
  size_t local_2b30;
  tinfl_decompressor local_2b28;
  
  *pOut_len = 0;
  local_2b28.m_state = 0;
  sVar3 = 0;
  lVar4 = 0;
  __size = 0;
  pmVar2 = (mz_uint8 *)0x0;
  local_2b38 = pSrc_buf;
  local_2b30 = src_buf_len;
  do {
    pOut_buf_start = pmVar2;
    local_2b40 = local_2b30 - lVar4;
    local_2b48 = __size - sVar3;
    pmVar2 = pOut_buf_start + sVar3;
    if (pOut_buf_start == (mz_uint8 *)0x0) {
      pmVar2 = (mz_uint8 *)0x0;
    }
    tVar1 = tinfl_decompress(&local_2b28,(mz_uint8 *)((long)local_2b38 + lVar4),&local_2b40,
                             pOut_buf_start,pmVar2,&local_2b48,flags & 0xfffffff9U | 4);
    if ((tVar1 < TINFL_STATUS_DONE) || (tVar1 == TINFL_STATUS_NEEDS_MORE_INPUT)) break;
    lVar4 = lVar4 + local_2b40;
    sVar3 = *pOut_len + local_2b48;
    *pOut_len = sVar3;
    if (tVar1 == TINFL_STATUS_DONE) {
      return pOut_buf_start;
    }
    __size = __size * 2;
    if (__size < 0x81) {
      __size = 0x80;
    }
    pmVar2 = (mz_uint8 *)realloc(pOut_buf_start,__size);
  } while (pmVar2 != (mz_uint8 *)0x0);
  free(pOut_buf_start);
  *pOut_len = 0;
  return (void *)0x0;
}

Assistant:

void *tinfl_decompress_mem_to_heap(const void *pSrc_buf, size_t src_buf_len,
                                   size_t *pOut_len, int flags) {
  tinfl_decompressor decomp;
  void *pBuf = NULL, *pNew_buf;
  size_t src_buf_ofs = 0, out_buf_capacity = 0;
  *pOut_len = 0;
  tinfl_init(&decomp);
  for (;;) {
    size_t src_buf_size = src_buf_len - src_buf_ofs,
           dst_buf_size = out_buf_capacity - *pOut_len, new_out_buf_capacity;
    tinfl_status status = tinfl_decompress(
        &decomp, (const mz_uint8 *)pSrc_buf + src_buf_ofs, &src_buf_size,
        (mz_uint8 *)pBuf, pBuf ? (mz_uint8 *)pBuf + *pOut_len : NULL,
        &dst_buf_size,
        (flags & ~TINFL_FLAG_HAS_MORE_INPUT) |
            TINFL_FLAG_USING_NON_WRAPPING_OUTPUT_BUF);
    if ((status < 0) || (status == TINFL_STATUS_NEEDS_MORE_INPUT)) {
      MZ_FREE(pBuf);
      *pOut_len = 0;
      return NULL;
    }
    src_buf_ofs += src_buf_size;
    *pOut_len += dst_buf_size;
    if (status == TINFL_STATUS_DONE)
      break;
    new_out_buf_capacity = out_buf_capacity * 2;
    if (new_out_buf_capacity < 128)
      new_out_buf_capacity = 128;
    pNew_buf = MZ_REALLOC(pBuf, new_out_buf_capacity);
    if (!pNew_buf) {
      MZ_FREE(pBuf);
      *pOut_len = 0;
      return NULL;
    }
    pBuf = pNew_buf;
    out_buf_capacity = new_out_buf_capacity;
  }
  return pBuf;
}